

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O3

void substitute_alias(DESCRIPTOR_DATA *d,char *argument)

{
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  CHAR_DATA *ch;
  char buf [4608];
  char name [4608];
  char local_2438 [4607];
  undefined1 local_1239;
  char local_1238 [4616];
  
  ch = d->original;
  if (ch == (CHAR_DATA *)0x0) {
    ch = d->character;
  }
  bVar2 = is_npc(ch);
  if ((((bVar2) || (ch->pcdata->alias[0] == (char *)0x0)) ||
      (bVar2 = str_prefix("alias",argument), !bVar2)) ||
     ((bVar2 = str_prefix("una",argument), !bVar2 || (bVar2 = str_prefix("prefix",argument), !bVar2)
      ))) {
    interpret(d->character,argument);
    return;
  }
  strcpy(local_2438,argument);
  lVar6 = 0;
  do {
    pcVar4 = ch->pcdata->alias[lVar6];
    if (pcVar4 == (char *)0x0) break;
    bVar2 = str_prefix(pcVar4,argument);
    if (!bVar2) {
      pcVar4 = one_argument(argument,local_1238);
      pPVar1 = ch->pcdata;
      iVar3 = strcmp(pPVar1->alias[lVar6],local_1238);
      if (iVar3 == 0) {
        local_2438[0] = '\0';
        strcat(local_2438,pPVar1->alias_sub[lVar6]);
        sVar5 = strlen(local_2438);
        (local_2438 + sVar5)[0] = ' ';
        (local_2438 + sVar5)[1] = '\0';
        strcat(local_2438,pcVar4);
        break;
      }
      sVar5 = strlen(local_2438);
      if (0x1200 < sVar5) {
        send_to_char("Alias substitution too long. Truncated.\r\n",ch);
        local_1239 = 0;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  interpret(d->character,local_2438);
  return;
}

Assistant:

void substitute_alias(DESCRIPTOR_DATA *d, char *argument)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH], name[MAX_INPUT_LENGTH];
	char *point;
	int alias;

	ch = d->original ? d->original : d->character;

	if (is_npc(ch)
		|| ch->pcdata->alias[0] == nullptr
		|| !str_prefix("alias", argument)
		|| !str_prefix("una", argument)
		|| !str_prefix("prefix", argument))
	{
		interpret(d->character, argument);
		return;
	}

	sprintf(buf, "%s", argument);

	for (alias = 0; alias < MAX_ALIAS; alias++) /* go through the aliases */
	{
		if (ch->pcdata->alias[alias] == nullptr)
			break;

		if (!str_prefix(ch->pcdata->alias[alias], argument))
		{
			point = one_argument(argument, name);

			if (!strcmp(ch->pcdata->alias[alias], name))
			{
				buf[0] = '\0';

				strcat(buf, ch->pcdata->alias_sub[alias]);
				strcat(buf, " ");
				strcat(buf, point);
				break;
			}

			if (strlen(buf) > MAX_INPUT_LENGTH)
			{
				send_to_char("Alias substitution too long. Truncated.\r\n", ch);
				buf[MAX_INPUT_LENGTH - 1] = '\0';
			}
		}
	}

	interpret(d->character, buf);
}